

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ListBoxFooter(void)

{
  ImGuiStyle *pIVar1;
  ImGuiStyle *style;
  ImRect bb;
  ImGuiWindow *parent_window;
  
  bb.Max = (ImVec2)GetParentWindow();
  style = *(ImGuiStyle **)&((ImRect *)((long)bb.Max + 0xfc))->Min;
  bb.Min = *(ImVec2 *)((long)bb.Max + 0x104);
  pIVar1 = GetStyle();
  EndChildFrame();
  SameLine(0.0,-1.0);
  *(ImGuiStyle **)((long)bb.Max + 0xc0) = style;
  ItemSize((ImRect *)&style,(pIVar1->FramePadding).y);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow* parent_window = GetParentWindow();
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}